

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

BinOpr subexpr(LexState *ls,expdesc *v,uint limit)

{
  Token *pTVar1;
  Token *pTVar2;
  unsigned_short *puVar3;
  byte bVar4;
  expkind eVar5;
  FuncState *pFVar6;
  Instruction *pIVar7;
  SemInfo SVar8;
  bool bVar9;
  undefined4 uVar10;
  BinOpr BVar11;
  int iVar12;
  BinOpr BVar13;
  uint uVar14;
  long lVar15;
  OpCode OVar16;
  int *l1;
  ulong uVar17;
  expdesc v2;
  Value local_68;
  anon_struct_8_2_626ab7dd_for_s aStack_60;
  undefined8 local_58;
  uint local_4c;
  int *local_48;
  SemInfo *local_40;
  Token *local_38;
  
  uVar14 = *(int *)&ls->L->nCcalls + 1;
  ls->L->nCcalls = (unsigned_short)uVar14;
  local_4c = limit;
  if (200 < (uVar14 & 0xffff)) {
    luaX_lexerror(ls,"chunk has too many syntax levels",0);
  }
  iVar12 = (ls->t).token;
  if (iVar12 == 0x23) {
    lVar15 = 2;
LAB_0010cf22:
    bVar9 = false;
  }
  else {
    if (iVar12 == 0x10e) {
      lVar15 = 1;
      goto LAB_0010cf22;
    }
    if (iVar12 == 0x2d) {
      bVar9 = false;
      lVar15 = 0;
    }
    else {
      lVar15 = 3;
      bVar9 = true;
    }
  }
  pTVar1 = &ls->t;
  if (!bVar9) {
    iVar12 = (ls->lookahead).token;
    ls->lastline = ls->linenumber;
    if (iVar12 == 0x11f) {
      iVar12 = llex(ls,&(ls->t).seminfo);
      (ls->t).token = iVar12;
    }
    else {
      pTVar2 = &ls->lookahead;
      uVar10 = *(undefined4 *)&pTVar2->field_0x4;
      SVar8 = (ls->lookahead).seminfo;
      pTVar1->token = pTVar2->token;
      *(undefined4 *)&pTVar1->field_0x4 = uVar10;
      (ls->t).seminfo = SVar8;
      pTVar2->token = 0x11f;
    }
    subexpr(ls,v,8);
    local_58 = 0xffffffffffffffff;
    local_68.b = 5;
    aStack_60.info = 0;
    aStack_60.aux = 0;
    BVar11 = (*(code *)((long)&DAT_001141d4 + (long)(int)(&DAT_001141d4)[lVar15]))();
    return BVar11;
  }
  if (iVar12 < 0x113) {
    if (iVar12 < 0x109) {
      if (iVar12 != 0x7b) {
        if (iVar12 == 0x107) {
          v->t = -1;
          v->f = -1;
          v->k = VFALSE;
LAB_0010d164:
          (v->u).s.info = 0;
          goto LAB_0010d1c6;
        }
        goto LAB_0010d205;
      }
      constructor(ls,v);
    }
    else {
      if (iVar12 != 0x109) {
        if (iVar12 == 0x10d) {
          v->t = -1;
          v->f = -1;
          v->k = VNIL;
          goto LAB_0010d164;
        }
        goto LAB_0010d205;
      }
      iVar12 = (ls->lookahead).token;
      ls->lastline = ls->linenumber;
      if (iVar12 == 0x11f) {
        iVar12 = llex(ls,&(ls->t).seminfo);
        (ls->t).token = iVar12;
      }
      else {
        pTVar2 = &ls->lookahead;
        uVar10 = *(undefined4 *)&pTVar2->field_0x4;
        SVar8 = (ls->lookahead).seminfo;
        pTVar1->token = pTVar2->token;
        *(undefined4 *)&pTVar1->field_0x4 = uVar10;
        (ls->t).seminfo = SVar8;
        pTVar2->token = 0x11f;
      }
      body(ls,v,0,ls->linenumber);
    }
  }
  else {
    if (iVar12 < 0x11c) {
      if (iVar12 == 0x113) {
        v->t = -1;
        v->f = -1;
        v->k = VTRUE;
        goto LAB_0010d164;
      }
      if (iVar12 == 0x117) {
        pFVar6 = ls->fs;
        bVar4 = pFVar6->f->is_vararg;
        if (bVar4 == 0) {
          luaX_lexerror(ls,"cannot use \'...\' outside a vararg function",0x117);
        }
        pFVar6->f->is_vararg = bVar4 & 0xfb;
        iVar12 = luaK_code(pFVar6,0x800025,pFVar6->ls->lastline);
        v->t = -1;
        v->f = -1;
        v->k = VVARARG;
        goto LAB_0010d1c2;
      }
    }
    else {
      if (iVar12 == 0x11e) {
        local_68 = *(Value *)&(ls->t).seminfo;
        aStack_60.info = 4;
        iVar12 = addk(ls->fs,(TValue *)&local_68,(TValue *)&local_68);
        v->t = -1;
        v->f = -1;
        v->k = VK;
LAB_0010d1c2:
        (v->u).s.info = iVar12;
LAB_0010d1c6:
        iVar12 = (ls->lookahead).token;
        ls->lastline = ls->linenumber;
        if (iVar12 == 0x11f) {
          iVar12 = llex(ls,&(ls->t).seminfo);
          (ls->t).token = iVar12;
        }
        else {
          pTVar2 = &ls->lookahead;
          uVar10 = *(undefined4 *)&pTVar2->field_0x4;
          SVar8 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar10;
          (ls->t).seminfo = SVar8;
          pTVar2->token = 0x11f;
        }
        goto LAB_0010d2c5;
      }
      if (iVar12 == 0x11c) {
        v->t = -1;
        v->f = -1;
        v->k = VKNUM;
        (v->u).s.info = 0;
        v->u = (anon_union_8_2_fd02c123_for_u)(ls->t).seminfo;
        goto LAB_0010d1c6;
      }
    }
LAB_0010d205:
    primaryexp(ls,v);
  }
LAB_0010d2c5:
  iVar12 = pTVar1->token;
  if (iVar12 < 0x5e) {
    switch(iVar12) {
    case 0x25:
      BVar11 = OPR_MOD;
      break;
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
switchD_0010d2e7_caseD_26:
      BVar11 = OPR_NOBINOPR;
      bVar9 = true;
      goto LAB_0010d38e;
    case 0x2a:
      BVar11 = OPR_MUL;
      break;
    case 0x2b:
      bVar9 = false;
      BVar11 = OPR_ADD;
      goto LAB_0010d38e;
    case 0x2d:
      BVar11 = OPR_SUB;
      break;
    case 0x2f:
      BVar11 = OPR_DIV;
      break;
    default:
      if (iVar12 == 0x3c) {
        BVar11 = OPR_LT;
      }
      else {
        if (iVar12 != 0x3e) goto switchD_0010d2e7_caseD_26;
        BVar11 = OPR_GT;
      }
    }
  }
  else {
    switch(iVar12) {
    case 0x10f:
      BVar11 = OPR_OR;
      break;
    case 0x110:
    case 0x111:
    case 0x112:
    case 0x113:
    case 0x114:
    case 0x115:
    case 0x117:
      goto switchD_0010d2e7_caseD_26;
    case 0x116:
      BVar11 = OPR_CONCAT;
      break;
    case 0x118:
      BVar11 = OPR_EQ;
      break;
    case 0x119:
      BVar11 = OPR_GE;
      break;
    case 0x11a:
      BVar11 = OPR_LE;
      break;
    case 0x11b:
      BVar11 = OPR_NE;
      break;
    default:
      if (iVar12 == 0x5e) {
        BVar11 = OPR_POW;
      }
      else {
        if (iVar12 != 0x101) goto switchD_0010d2e7_caseD_26;
        BVar11 = OPR_AND;
      }
    }
  }
  bVar9 = false;
LAB_0010d38e:
  if (!bVar9) {
    local_38 = &ls->lookahead;
    local_40 = &(ls->t).seminfo;
    local_48 = &v->t;
    do {
      uVar17 = (ulong)BVar11;
      if (priority[uVar17].left <= local_4c) break;
      iVar12 = (ls->lookahead).token;
      ls->lastline = ls->linenumber;
      if (iVar12 == 0x11f) {
        iVar12 = llex(ls,local_40);
        (ls->t).token = iVar12;
      }
      else {
        uVar10 = *(undefined4 *)&local_38->field_0x4;
        SVar8 = local_38->seminfo;
        pTVar1->token = local_38->token;
        *(undefined4 *)&pTVar1->field_0x4 = uVar10;
        (ls->t).seminfo = SVar8;
        local_38->token = 0x11f;
      }
      pFVar6 = ls->fs;
      switch(uVar17) {
      case 0:
      case 1:
      case 2:
      case 3:
      case 4:
      case 5:
        if (((v->k != VKNUM) || (v->t != -1)) || (v->f != -1)) goto switchD_0010d434_caseD_7;
        break;
      case 6:
        luaK_exp2nextreg(pFVar6,v);
        break;
      default:
switchD_0010d434_caseD_7:
        luaK_exp2RK(pFVar6,v);
        break;
      case 0xd:
        luaK_goiftrue(pFVar6,v);
        break;
      case 0xe:
        luaK_dischargevars(pFVar6,v);
        eVar5 = v->k;
        iVar12 = -1;
        if ((eVar5 != VNIL) && (eVar5 != VFALSE)) {
          if (eVar5 == VJMP) {
            iVar12 = (v->u).s.info;
          }
          else {
            iVar12 = jumponcond(pFVar6,v,1);
          }
        }
        luaK_concat(pFVar6,local_48,iVar12);
        iVar12 = v->f;
        pFVar6->lasttarget = pFVar6->pc;
        luaK_concat(pFVar6,&pFVar6->jpc,iVar12);
        v->f = -1;
      }
      BVar13 = subexpr(ls,(expdesc *)&local_68,(uint)priority[uVar17].right);
      if (OPR_OR < BVar11) goto LAB_0010d659;
      pFVar6 = ls->fs;
      switch(uVar17) {
      case 0:
        OVar16 = OP_ADD;
        break;
      case 1:
        OVar16 = OP_SUB;
        break;
      case 2:
        OVar16 = OP_MUL;
        break;
      case 3:
        OVar16 = OP_DIV;
        break;
      case 4:
        OVar16 = OP_MOD;
        break;
      case 5:
        OVar16 = OP_POW;
        break;
      case 6:
        luaK_exp2val(pFVar6,(expdesc *)&local_68);
        if (local_68.b == 0xb) {
          pIVar7 = pFVar6->f->code;
          lVar15 = (long)aStack_60.info;
          if ((pIVar7[lVar15] & 0x3f) == 0x15) {
            if (((v->k == VNONRELOC) && (uVar14 = (v->u).s.info, (uVar14 >> 8 & 1) == 0)) &&
               ((int)(uint)pFVar6->nactvar <= (int)uVar14)) {
              pFVar6->freereg = pFVar6->freereg + -1;
            }
            pIVar7[lVar15] = (v->u).s.info << 0x17 | pIVar7[lVar15] & 0x7fffff;
            v->k = VRELOCABLE;
            (v->u).s.info = aStack_60.info;
            goto LAB_0010d659;
          }
        }
        luaK_exp2nextreg(pFVar6,(expdesc *)&local_68);
        OVar16 = OP_CONCAT;
        break;
      case 7:
        OVar16 = OP_EQ;
        goto LAB_0010d557;
      case 8:
        OVar16 = OP_EQ;
        goto LAB_0010d629;
      case 9:
        OVar16 = OP_LT;
        goto LAB_0010d629;
      case 10:
        OVar16 = OP_LE;
LAB_0010d629:
        iVar12 = 1;
        goto LAB_0010d62e;
      case 0xb:
        OVar16 = OP_LT;
        goto LAB_0010d557;
      case 0xc:
        OVar16 = OP_LE;
LAB_0010d557:
        iVar12 = 0;
LAB_0010d62e:
        codecomp(pFVar6,OVar16,iVar12,v,(expdesc *)&local_68);
        goto LAB_0010d659;
      case 0xd:
        luaK_dischargevars(pFVar6,(expdesc *)&local_68);
        iVar12 = v->f;
        l1 = (int *)((long)&local_58 + 4);
        goto LAB_0010d58f;
      case 0xe:
        luaK_dischargevars(pFVar6,(expdesc *)&local_68);
        iVar12 = v->t;
        l1 = (int *)&local_58;
LAB_0010d58f:
        luaK_concat(pFVar6,l1,iVar12);
        v->t = (undefined4)local_58;
        v->f = local_58._4_4_;
        *(Value *)v = local_68;
        (v->u).s = aStack_60;
        goto LAB_0010d659;
      }
      codearith(pFVar6,OVar16,v,(expdesc *)&local_68);
LAB_0010d659:
      BVar11 = BVar13;
    } while (BVar13 != OPR_NOBINOPR);
  }
  puVar3 = &ls->L->nCcalls;
  *puVar3 = *puVar3 - 1;
  return BVar11;
}

Assistant:

static BinOpr subexpr(LexState*ls,expdesc*v,unsigned int limit){
BinOpr op;
UnOpr uop;
enterlevel(ls);
uop=getunopr(ls->t.token);
if(uop!=OPR_NOUNOPR){
luaX_next(ls);
subexpr(ls,v,8);
luaK_prefix(ls->fs,uop,v);
}
else simpleexp(ls,v);
op=getbinopr(ls->t.token);
while(op!=OPR_NOBINOPR&&priority[op].left>limit){
expdesc v2;
BinOpr nextop;
luaX_next(ls);
luaK_infix(ls->fs,op,v);
nextop=subexpr(ls,&v2,priority[op].right);
luaK_posfix(ls->fs,op,v,&v2);
op=nextop;
}
leavelevel(ls);
return op;
}